

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O3

int CfdAddTransactionOutput
              (void *handle,void *create_handle,int64_t value_satoshi,char *address,
              char *direct_locking_script,char *asset_string)

{
  pointer pcVar1;
  ConfidentialTransactionContext *this;
  bool bVar2;
  CfdException *pCVar3;
  bool is_bitcoin;
  Amount amount;
  ConfidentialAssetId asset;
  ConfidentialNonce nonce;
  ElementsConfidentialAddress confidential_addr;
  allocator local_26a;
  bool local_269;
  void *local_268;
  Amount local_260;
  ConfidentialAssetId local_250;
  string local_228;
  undefined1 local_208 [16];
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> local_1f8;
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [16];
  pointer local_1b0;
  pointer local_198;
  pointer local_180;
  TapBranch local_168;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_f0;
  Script local_d8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_98 [2];
  
  local_268 = handle;
  cfd::Initialize();
  pcVar1 = local_1e0 + 0x10;
  local_1e0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1e0,"TransactionData","");
  cfd::capi::CheckBuffer(create_handle,(string *)local_1e0);
  if ((pointer)local_1e0._0_8_ != pcVar1) {
    operator_delete((void *)local_1e0._0_8_);
  }
  local_269 = false;
  cfd::capi::ConvertNetType(*(int *)((long)create_handle + 0x10),&local_269);
  cfd::core::Amount::Amount(&local_260,value_satoshi);
  this = *(ConfidentialTransactionContext **)((long)create_handle + 0x18);
  if (this == (ConfidentialTransactionContext *)0x0) {
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    local_1e0._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1e0,"Invalid handle state. tx is null","");
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalStateError,(string *)local_1e0);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (local_269 == true) {
    bVar2 = cfd::capi::IsEmptyString(address);
    if (bVar2) {
      bVar2 = cfd::capi::IsEmptyString(direct_locking_script);
      if (bVar2) {
        return 0;
      }
      std::__cxx11::string::string
                ((string *)&local_250,direct_locking_script,(allocator *)local_208);
      cfd::core::Script::Script((Script *)local_1e0,(string *)&local_250);
      cfd::core::Transaction::AddTxOut((Transaction *)this,&local_260,(Script *)local_1e0);
      cfd::core::Script::~Script((Script *)local_1e0);
    }
    else {
      std::__cxx11::string::string((string *)&local_250,address,(allocator *)local_208);
      cfd::core::Address::Address((Address *)local_1e0,(string *)&local_250);
      (*(this->super_ConfidentialTransaction).super_AbstractTransaction._vptr_AbstractTransaction
        [0x12])(this,local_1e0,&local_260);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(local_98);
      cfd::core::Script::~Script(&local_d8);
      local_168._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_0072eb30;
      std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                (&local_f0);
      cfd::core::TapBranch::~TapBranch(&local_168);
      if (local_180 != (pointer)0x0) {
        operator_delete(local_180);
      }
      if (local_198 != (pointer)0x0) {
        operator_delete(local_198);
      }
      if (local_1b0 != (pointer)0x0) {
        operator_delete(local_1b0);
      }
      if ((undefined1 *)local_1e0._16_8_ != local_1c0) {
        operator_delete((void *)local_1e0._16_8_);
      }
    }
    local_250.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_250._vptr_ConfidentialAssetId;
    if (local_250._vptr_ConfidentialAssetId ==
        (_func_int **)
        &local_250.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
         _M_impl.super__Vector_impl_data._M_finish) {
      return 0;
    }
  }
  else {
    bVar2 = cfd::capi::IsEmptyString(asset_string);
    if (bVar2) {
      local_1e0._0_8_ = "cfdcapi_transaction.cpp";
      local_1e0._8_4_ = 0x172;
      local_1e0._16_8_ = "CfdAddTransactionOutput";
      cfd::core::logger::log<>
                ((CfdSourceLocation *)local_1e0,kCfdLogLevelWarning,"asset is null or empty.");
      pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
      local_1e0._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1e0,"Failed to parameter. asset is null or empty.","");
      cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_1e0);
      __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
    }
    std::__cxx11::string::string((string *)local_1e0,asset_string,(allocator *)local_208);
    cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_250,(string *)local_1e0);
    if ((pointer)local_1e0._0_8_ != pcVar1) {
      operator_delete((void *)local_1e0._0_8_);
    }
    bVar2 = cfd::capi::IsEmptyString(address);
    if (bVar2) {
      bVar2 = cfd::capi::IsEmptyString(direct_locking_script);
      if (bVar2) {
        cfd::ConfidentialTransactionContext::UpdateFeeAmount(this,&local_260,&local_250);
      }
      else {
        cfd::core::ConfidentialNonce::ConfidentialNonce((ConfidentialNonce *)local_208);
        std::__cxx11::string::string((string *)&local_228,direct_locking_script,&local_26a);
        cfd::core::Script::Script((Script *)local_1e0,&local_228);
        cfd::core::ConfidentialTransaction::AddTxOut
                  (&this->super_ConfidentialTransaction,&local_260,&local_250,(Script *)local_1e0,
                   (ConfidentialNonce *)local_208);
        cfd::core::Script::~Script((Script *)local_1e0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228._M_dataplus._M_p != &local_228.field_2) {
          operator_delete(local_228._M_dataplus._M_p);
        }
        local_208._0_8_ = &PTR__ConfidentialNonce_00723710;
        if ((pointer)local_208._8_8_ != (pointer)0x0) {
          operator_delete((void *)local_208._8_8_);
        }
      }
    }
    else {
      cfd::ElementsAddressFactory::ElementsAddressFactory((ElementsAddressFactory *)local_208);
      std::__cxx11::string::string((string *)local_1e0,address,(allocator *)&local_228);
      bVar2 = cfd::core::ElementsConfidentialAddress::IsConfidentialAddress((string *)local_1e0);
      if ((pointer)local_1e0._0_8_ != pcVar1) {
        operator_delete((void *)local_1e0._0_8_);
      }
      if (bVar2) {
        std::__cxx11::string::string((string *)&local_228,address,&local_26a);
        cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
                  ((ElementsConfidentialAddress *)local_1e0,&local_228);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228._M_dataplus._M_p != &local_228.field_2) {
          operator_delete(local_228._M_dataplus._M_p);
        }
        (*(this->super_ConfidentialTransaction).super_AbstractTransaction._vptr_AbstractTransaction
          [0x13])(this,local_1e0,&local_260,&local_250,0);
        cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress
                  ((ElementsConfidentialAddress *)local_1e0);
      }
      else {
        std::__cxx11::string::string((string *)&local_228,address,&local_26a);
        cfd::AddressFactory::GetAddress((Address *)local_1e0,(AddressFactory *)local_208,&local_228)
        ;
        (*(this->super_ConfidentialTransaction).super_AbstractTransaction._vptr_AbstractTransaction
          [0x12])(this,local_1e0,&local_260,&local_250);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree(local_98);
        cfd::core::Script::~Script(&local_d8);
        local_168._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_0072eb30;
        std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                  (&local_f0);
        cfd::core::TapBranch::~TapBranch(&local_168);
        if (local_180 != (pointer)0x0) {
          operator_delete(local_180);
        }
        if (local_198 != (pointer)0x0) {
          operator_delete(local_198);
        }
        if (local_1b0 != (pointer)0x0) {
          operator_delete(local_1b0);
        }
        if ((undefined1 *)local_1e0._16_8_ != local_1c0) {
          operator_delete((void *)local_1e0._16_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228._M_dataplus._M_p != &local_228.field_2) {
          operator_delete(local_228._M_dataplus._M_p);
        }
      }
      local_208._0_8_ = &PTR__AddressFactory_007215c8;
      std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
      ~vector(&local_1f8);
    }
    local_250._vptr_ConfidentialAssetId = (_func_int **)&PTR__ConfidentialAssetId_00723760;
    if ((_func_int **)
        local_250.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start == (_func_int **)0x0) {
      return 0;
    }
  }
  operator_delete(local_250.data_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start);
  return 0;
}

Assistant:

int CfdAddTransactionOutput(
    void* handle, void* create_handle, int64_t value_satoshi,
    const char* address, const char* direct_locking_script,
    const char* asset_string) {
  try {
    cfd::Initialize();
    CheckBuffer(create_handle, kPrefixTransactionData);
    CfdCapiTransactionData* tx_data =
        static_cast<CfdCapiTransactionData*>(create_handle);

    bool is_bitcoin = false;
    ConvertNetType(tx_data->net_type, &is_bitcoin);
    Amount amount = Amount(value_satoshi);
    if (tx_data->tx_obj == nullptr) {
      throw CfdException(
          CfdError::kCfdIllegalStateError, "Invalid handle state. tx is null");
    } else if (is_bitcoin) {
      TransactionContext* tx =
          static_cast<TransactionContext*>(tx_data->tx_obj);
      if (!IsEmptyString(address)) {
        tx->AddTxOut(Address(address), amount);
      } else if (!IsEmptyString(direct_locking_script)) {
        tx->AddTxOut(amount, Script(direct_locking_script));
      }
    } else {
#ifndef CFD_DISABLE_ELEMENTS
      ConfidentialTransactionContext* tx =
          static_cast<ConfidentialTransactionContext*>(tx_data->tx_obj);
      if (IsEmptyString(asset_string)) {
        warn(CFD_LOG_SOURCE, "asset is null or empty.");
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            "Failed to parameter. asset is null or empty.");
      }
      ConfidentialAssetId asset = ConfidentialAssetId(asset_string);

      if (!IsEmptyString(address)) {
        ElementsAddressFactory address_factory;
        if (ElementsConfidentialAddress::IsConfidentialAddress(address)) {
          ElementsConfidentialAddress confidential_addr(address);
          tx->AddTxOut(confidential_addr, amount, asset, false);
        } else {
          tx->AddTxOut(address_factory.GetAddress(address), amount, asset);
        }
      } else if (!IsEmptyString(direct_locking_script)) {
        ConfidentialNonce nonce;
        tx->AddTxOut(amount, asset, Script(direct_locking_script), nonce);
      } else {
        tx->UpdateFeeAmount(amount, asset);
      }
#else
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#endif  // CFD_DISABLE_ELEMENTS
    }

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}